

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string_agg.cpp
# Opt level: O3

void duckdb::StringAggSerialize
               (Serializer *serializer,optional_ptr<duckdb::FunctionData,_true> bind_data_p,
               AggregateFunction *function)

{
  StringAggBindData bind_data;
  FunctionData local_50;
  undefined1 *local_48 [2];
  undefined1 local_38 [16];
  optional_ptr<duckdb::FunctionData,_true> local_28;
  
  local_28.ptr = bind_data_p.ptr;
  optional_ptr<duckdb::FunctionData,_true>::CheckValid(&local_28);
  local_50._vptr_FunctionData = (_func_int **)&PTR__StringAggBindData_019a3ba8;
  local_48[0] = local_38;
  ::std::__cxx11::string::_M_construct<char*>
            ((string *)local_48,local_28.ptr[1]._vptr_FunctionData,
             (long)local_28.ptr[2]._vptr_FunctionData + (long)local_28.ptr[1]._vptr_FunctionData);
  (*serializer->_vptr_Serializer[2])(serializer,100,"separator");
  (*serializer->_vptr_Serializer[0x1c])(serializer,(string *)local_48);
  (*serializer->_vptr_Serializer[3])(serializer);
  local_50._vptr_FunctionData = (_func_int **)&PTR__StringAggBindData_019a3ba8;
  if (local_48[0] != local_38) {
    operator_delete(local_48[0]);
  }
  FunctionData::~FunctionData(&local_50);
  return;
}

Assistant:

static void StringAggSerialize(Serializer &serializer, const optional_ptr<FunctionData> bind_data_p,
                               const AggregateFunction &function) {
	auto bind_data = bind_data_p->Cast<StringAggBindData>();
	serializer.WriteProperty(100, "separator", bind_data.sep);
}